

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O2

void RigidBodyDynamics::CalcMInvTimesTau
               (Model *model,VectorNd *Q,VectorNd *Tau,VectorNd *QDDot,bool update_kinematics)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  JointType JVar5;
  uint uVar6;
  pointer pJVar7;
  pointer ppCVar8;
  CustomJoint *pCVar9;
  double *pdVar10;
  pointer pSVar11;
  ulong uVar12;
  long lVar13;
  pointer pSVar14;
  long lVar15;
  SpatialTransform *pSVar16;
  undefined7 in_register_00000081;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  ResScalar RVar23;
  double dVar24;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  pointer local_3d0;
  SpatialVector *local_3c8;
  SpatialMatrix *local_3c0;
  Vector3d *local_3b8;
  VectorNd *local_3b0;
  VectorNd *local_3a8;
  long local_3a0;
  SpatialVector pa;
  SpatialMatrix Ia;
  Vector3d tau_temp;
  
  bVar22 = 0;
  local_3b0 = QDDot;
  local_3a8 = Tau;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start);
  if ((int)CONCAT71(in_register_00000081,update_kinematics) != 0) {
    for (uVar19 = 1;
        uVar19 < (ulong)(((long)(model->mBodies).
                                super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                .
                                super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->mBodies).
                               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x70);
        uVar19 = (ulong)((int)uVar19 + 1)) {
      jcalc_X_lambda_S(model,(model->mJointUpdateOrder).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar19],Q);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 ((model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar19));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 ((model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar19));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 ((model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar19));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 ((model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar19));
      Math::SpatialRigidBodyInertia::setSpatialMatrix
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19,
                 (model->IA).
                 super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar19);
    }
  }
  for (uVar19 = 1;
      uVar12 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70, uVar19 < uVar12;
      uVar19 = (ulong)((int)uVar19 + 1)) {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               ((model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar19));
  }
  iVar18 = (int)uVar12;
  if (update_kinematics) {
    uVar19 = (ulong)(iVar18 - 1);
    local_3f0 = uVar19 * 0x60;
    local_3f8 = uVar19 * 0x120;
    local_3e0 = uVar19 * 0x48;
    local_3e8 = uVar19 * 0x90;
    local_3d8 = uVar19 * 0x30;
    lVar21 = uVar19 * 0xc + 10;
    for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
      pJVar7 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = *(int *)((long)pJVar7 + lVar21 * 2 + -0xc);
      iVar2 = *(int *)((long)pJVar7 + lVar21 * 2 + -8);
      if (iVar2 == 3) {
        if (iVar18 == 0x14) goto LAB_0023be1e;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->IA).
                               super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               .
                               super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_6,_0,_6,_6>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     local_3f8);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((long)&(((model->multdof3_S).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_3e8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                  ((Matrix<double,_6,_3,_0,_6,_3> *)
                   ((long)&(((model->multdof3_U).
                             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
                   local_3e8),
                   (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>
                    *)&Ia);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->multdof3_S).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_3e8);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((long)&(((model->multdof3_U).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_3e8);
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
        _set_noalias<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Ia,
                   (DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
                    *)&pa);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)
                   ((long)&(((model->multdof3_Dinv).
                             super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                             super__Vector_impl_data._M_start)->super_Matrix3d).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                   local_3e0),(Matrix<double,_3,_3,_0,_3,_3> *)&Ia);
        uVar12 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar12 == 0) goto LAB_0023bf88;
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->IA).
                               super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               .
                               super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_6,_0,_6,_6>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     local_3f8);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((long)&(((model->multdof3_U).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + local_3e8);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((long)&(((model->multdof3_Dinv).
                               super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_Matrix3d).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     + local_3e0);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             pa.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                    *)&pa);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)&pa,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                   local_3f0));
        Math::SpatialTransform::toMatrix
                  ((SpatialMatrix *)&tau_temp,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                   local_3f0));
LAB_0023bf6d:
        local_3b8 = &tau_temp;
        local_3c0 = &Ia;
        local_3c8 = &pa;
        local_3d0 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar12;
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&local_3d0,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)&local_3c8);
      }
      else if (iVar2 == 1) {
        if (iVar18 == 0x14) goto LAB_0023be1e;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->IA).
                               super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               .
                               super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_6,_0,_6,_6>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     local_3f8);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((long)&(((model->S).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                     local_3d8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)
                   ((long)&(((model->U).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + local_3d8)
                   ,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                     *)&Ia);
        RVar23 = Eigen::internal::
                 dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                 ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((long)&(((model->S).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                       local_3d8),
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((long)&(((model->U).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                       local_3d8));
        (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar19] = RVar23;
        uVar12 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar12 != 0) {
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)&(((model->IA).
                                 super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                                 .
                                 super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_6,_0,_6,_6>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       local_3f8);
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((long)&(((model->U).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                       local_3d8);
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               pa.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1];
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               RVar23;
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                      *)&pa);
          Math::SpatialTransform::toMatrixTranspose
                    ((SpatialMatrix *)&pa,
                     (SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_3f0));
          Math::SpatialTransform::toMatrix
                    ((SpatialMatrix *)&tau_temp,
                     (SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_3f0));
          goto LAB_0023bf6d;
        }
      }
      else if (iVar18 == 0x14) {
LAB_0023be1e:
        uVar3 = *(uint *)((long)&pJVar7->mJointAxes + lVar21 * 2);
        ppCVar8 = (model->mCustomJoints).
                  super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->IA).
                               super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               .
                               super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_6,_0,_6,_6>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     local_3f8);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)(ppCVar8[uVar3] + 0x70);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)(ppCVar8[uVar3] + 0x88),
                   (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                    *)&Ia);
        pCVar9 = (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3];
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)(pCVar9 + 0x70);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)(pCVar9 + 0x88);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&Ia,
                   (Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&pa);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)
                   ((model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar3] + 0xa0),
                   (Matrix<double,__1,__1,_0,__1,__1> *)&Ia);
        free((void *)Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0]);
        uVar12 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar12 != 0) {
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)&(((model->IA).
                                 super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                                 .
                                 super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_6,_0,_6,_6>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       local_3f8);
          pCVar9 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3];
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)(pCVar9 + 0x88);
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(pCVar9 + 0xa0);
          local_3a0 = lVar21;
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               pa.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1];
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                      *)&pa);
          Math::SpatialTransform::toMatrixTranspose
                    ((SpatialMatrix *)&pa,
                     (SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_3f0));
          Math::SpatialTransform::toMatrix
                    ((SpatialMatrix *)&tau_temp,
                     (SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     local_3f0));
          lVar21 = local_3a0;
          goto LAB_0023bf6d;
        }
      }
LAB_0023bf88:
      local_3f0 = local_3f0 + -0x60;
      local_3f8 = local_3f8 + -0x120;
      local_3e0 = local_3e0 + -0x48;
      local_3e8 = local_3e8 + -0x90;
      local_3d8 = local_3d8 + -0x30;
      lVar21 = lVar21 + -0xc;
    }
    iVar18 = (int)(((long)(model->mBodies).
                          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x70);
  }
  uVar19 = (ulong)(iVar18 - 1);
  lVar13 = uVar19 * 0x60;
  lVar20 = uVar19 * 0x30;
  lVar21 = uVar19 * 0x18;
  lVar15 = uVar19 * 0x48;
  lVar17 = uVar19 * 0x90;
  for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
    pJVar7 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(uint *)((long)&pJVar7->q_index + lVar21);
    dVar24 = (double)(ulong)uVar3;
    iVar18 = *(int *)((long)&pJVar7->mJointType + lVar21);
    iVar2 = *(int *)((long)&pJVar7->mDoFCount + lVar21);
    if (iVar2 == 3) {
      if (iVar18 == 0x14) goto LAB_0023c2a8;
      pdVar10 = (local_3a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
      .m_data.array[0] = pdVar10[(long)dVar24];
      tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
      .m_data.array[1] = pdVar10[uVar3 + 1];
      tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
      .m_data.array[2] = pdVar10[uVar3 + 2];
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
           (double)((long)&(((model->multdof3_S).
                             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
                   lVar17);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
           (double)((long)&(((model->pA).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)&tau_temp;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 ((long)&(((model->multdof3_u).
                           super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                           super__Vector_impl_data._M_start)->super_Vector3d).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                 lVar21),(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                          *)&Ia);
      uVar12 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19];
      if (uVar12 != 0) {
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->pA).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((long)&(((model->multdof3_U).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + lVar17);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((long)&(((model->multdof3_Dinv).
                               super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_Matrix3d).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     + lVar15);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (double)((long)&(((model->multdof3_u).
                               super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_Vector3d).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     + lVar21);
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&pa);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar13)
                   ,(SpatialVector *)&Ia);
        local_3c8 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar12;
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&local_3c8,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&pa);
      }
    }
    else if (iVar2 == 1) {
      if (iVar18 == 0x14) {
LAB_0023c2a8:
        uVar3 = *(uint *)((long)&pJVar7->custom_joint_index + lVar21);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)(ulong)*(uint *)((model->mCustomJoints).
                                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar3] + 8);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((local_3a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + (long)dVar24);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
             (double)(local_3a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             4.94065645841247e-324;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
             (double)local_3a8;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0
        ;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
             dVar24;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,_1,false>>
                  ((Matrix<double,_1,1,0,_1,1> *)&tau_temp,
                   (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&Ia);
        ppCVar8 = (model->mCustomJoints).
                  super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)(ppCVar8[uVar3] + 0x70);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)((long)&(((model->pA).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)&tau_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)(ppCVar8[uVar3] + 0xb8),
                   (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&Ia);
        uVar12 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar12 != 0) {
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)&(((model->pA).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20
                       );
          pCVar9 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3];
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)(pCVar9 + 0x88);
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(pCVar9 + 0xa0);
          pa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               (double)(pCVar9 + 0xb8);
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&Ia,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)&pa);
          Math::SpatialTransform::applyTranspose
                    ((SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     lVar13),(SpatialVector *)&Ia);
          local_3c8 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar12;
          Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&local_3c8,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&pa);
        }
        free((void *)tau_temp.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
      }
      else {
        dVar24 = (local_3a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data[(long)dVar24];
        RVar23 = Eigen::internal::
                 dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                 ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((long)&(((model->S).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20
                       ),(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         ((long)&(((model->pA).
                                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                   .
                                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_Matrix<double,_6,_1,_0,_6,_1>).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                         lVar20));
        dVar24 = dVar24 - RVar23;
        (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar19] = dVar24;
        uVar12 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar12 != 0) {
          Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((long)&(((model->pA).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20
                       );
          Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)((long)&(((model->U).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20
                       );
          Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar19];
          Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
               dVar24;
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)&Ia);
          Math::SpatialTransform::applyTranspose
                    ((SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     lVar13),&pa);
          tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] =
               (double)((model->pA).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12);
          Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&tau_temp,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Ia);
        }
      }
    }
    else if (iVar18 == 0x14) goto LAB_0023c2a8;
    lVar13 = lVar13 + -0x60;
    lVar20 = lVar20 + -0x30;
    lVar21 = lVar21 + -0x18;
    lVar15 = lVar15 + -0x48;
    lVar17 = lVar17 + -0x90;
  }
  uVar19 = 1;
  do {
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar19) {
      return;
    }
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar19].q_index;
    uVar4 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19];
    pSVar11 = (model->X_lambda).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar14 = pSVar11 + uVar19;
    pSVar16 = (SpatialTransform *)&Ia;
    for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pSVar16->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&(pSVar14->E).super_Matrix3d;
      pSVar14 = (pointer)((long)pSVar14 + ((ulong)bVar22 * -2 + 1) * 8);
      pSVar16 = (SpatialTransform *)((long)pSVar16 + (ulong)bVar22 * -0x10 + 8);
    }
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
         *(double *)((long)&pSVar11[uVar19].r.super_Vector3d + 0x10);
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
         *(double *)
          &pSVar11[uVar19].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
         *(double *)
          ((long)&pSVar11[uVar19].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    Math::SpatialTransform::apply
              ((SpatialTransform *)&Ia,
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar4);
    tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] =
         (double)((model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar19);
    tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = (double)&pa;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
              (&(model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>
               ,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                 *)&tau_temp);
    pJVar7 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    JVar5 = pJVar7[uVar19].mJointType;
    if (pJVar7[uVar19].mDoFCount == 3) {
      if (JVar5 == JointTypeCustom) goto LAB_0023c6b6;
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)((model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19);
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           (double)((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar19);
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           (double)((model->multdof3_U).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19);
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
           (double)((model->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar19);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tau_temp,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                  *)&pa);
      pdVar10 = (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      pdVar10[uVar3] =
           tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
      pdVar10[uVar3 + 1] =
           tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      pdVar10[uVar3 + 2] =
           tau_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)((model->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar19);
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           (double)((model->multdof3_S).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19);
      pa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           (double)&tau_temp;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 pa.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0],(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)&pa);
    }
    else if (pJVar7[uVar19].mDoFCount == 1) {
      if (JVar5 == JointTypeCustom) {
LAB_0023c6b6:
        uVar4 = pJVar7[uVar19].custom_joint_index;
        pCVar9 = (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4];
        uVar6 = *(uint *)(pCVar9 + 8);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)(pCVar9 + 0xa0);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)(pCVar9 + 0xb8);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)(pCVar9 + 0x88);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&tau_temp,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)&pa);
        pdVar10 = (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
          pdVar10[uVar3 + (int)uVar12] =
               *(double *)
                ((long)tau_temp.super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] + uVar12 * 8);
        }
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->mCustomJoints).
                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4] + 0x70);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)&tau_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)
                   pa.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0],(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                             *)&pa);
        free((void *)tau_temp.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
      }
      else {
        dVar24 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data[uVar19];
        dVar1 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar19];
        RVar23 = Eigen::internal::
                 dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                 ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((model->U).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar19),
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar19));
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (dVar1 - RVar23) * (1.0 / dVar24);
        (local_3b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar3] = pa.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3];
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        pa.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->S).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)
                   pa.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0],(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                             *)&pa);
      }
    }
    else if (JVar5 == JointTypeCustom) goto LAB_0023c6b6;
    uVar19 = (ulong)((int)uVar19 + 1);
  } while( true );
}

Assistant:

RBDL_DLLAPI void CalcMInvTimesTau ( Model &model,
    const VectorNd &Q,
    const VectorNd &Tau,
    VectorNd &QDDot,
    bool update_kinematics) {

  LOG << "Q          = " << Q.transpose() << std::endl;
  LOG << "---" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      jcalc_X_lambda_S (model, model.mJointUpdateOrder[i], Q);

      model.v_J[i].setZero();
      model.v[i].setZero();
      model.c[i].setZero();
      model.pA[i].setZero();
      model.I[i].setSpatialMatrix (model.IA[i]);
    }
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    model.pA[i].setZero();
  }

  // ClearLogOutput();

  if (update_kinematics) {
    // Compute Articulate Body Inertias
    for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
      unsigned int q_index = model.mJoints[i].q_index;

      if (model.mJoints[i].mDoFCount == 1
          && model.mJoints[i].mJointType != JointTypeCustom) {
        model.U[i] = model.IA[i] * model.S[i];
        model.d[i] = model.S[i].dot(model.U[i]);
        //      LOG << "u[" << i << "] = " << model.u[i] << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] - 
            model.U[i] * (model.U[i] / model.d[i]).transpose();

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mDoFCount == 3
          && model.mJoints[i].mJointType != JointTypeCustom) {

        model.multdof3_U[i] = model.IA[i] * model.multdof3_S[i];

#ifdef RBDL_USE_CASADI_MATH
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose() * model.multdof3_U[i]).inverse();
#else
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose()*model.multdof3_U[i]).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u[i].transpose() << std::endl;

        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i]
            - ( model.multdof3_U[i]
                * model.multdof3_Dinv[i]
                * model.multdof3_U[i].transpose());

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mJointType == JointTypeCustom) {
        unsigned int kI     = model.mJoints[i].custom_joint_index;
        unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
        model.mCustomJoints[kI]->U = model.IA[i] * model.mCustomJoints[kI]->S;

#ifdef RBDL_USE_CASADI_MATH
        model.mCustomJoints[kI]->Dinv=(model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse();
#else
        model.mCustomJoints[kI]->Dinv = (model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u.transpose() << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] 
            - ( model.mCustomJoints[kI]->U
                * model.mCustomJoints[kI]->Dinv
                * model.mCustomJoints[kI]->U.transpose());
#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      }
    }
  }

  // compute articulated bias forces
  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {

      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);
      // LOG << "u[" << i << "] = " << model.u[i] << std::endl;
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialVector pa = model.pA[i] + model.U[i] * model.u[i] / model.d[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {

      Vector3d tau_temp ( Tau[q_index],
          Tau[q_index + 1],
          Tau[q_index + 2]);
      model.multdof3_u[i] = tau_temp 
        - model.multdof3_S[i].transpose()*model.pA[i];
      //      LOG << "multdof3_u[" << i << "] = "
      // << model.multdof3_u[i].transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + model.multdof3_U[i]
          * model.multdof3_Dinv[i]
          * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd tau_temp(Tau.block(q_index,0,dofI,1));

      model.mCustomJoints[kI]->u = 
        tau_temp - ( model.mCustomJoints[kI]->S.transpose()* model.pA[i]);
      //      LOG << "mCustomJoints[kI]->u"
      // << model.mCustomJoints[kI]->u.transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + (   model.mCustomJoints[kI]->U
              * model.mCustomJoints[kI]->Dinv
              * model.mCustomJoints[kI]->u);

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    }
  }

  //  ClearLogOutput();

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i])*(model.u[i]-model.U[i].dot(model.a[i]));
      model.a[i]     = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = 
        model.multdof3_Dinv[i] * (model.multdof3_u[i]
            - model.multdof3_U[i].transpose()*model.a[i]);

      QDDot[q_index]      = qdd_temp[0];
      QDDot[q_index + 1]  = qdd_temp[1];
      QDDot[q_index + 2]  = qdd_temp[2];
      model.a[i]          = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;

      VectorNd qdd_temp = model.mCustomJoints[kI]->Dinv
        * (  model.mCustomJoints[kI]->u 
            - model.mCustomJoints[kI]->U.transpose() * model.a[i]);

      for(unsigned z = 0; z < dofI; ++z){
        QDDot[q_index+z]      = qdd_temp[z];
      }

      model.a[i] =    model.a[i]
        + model.mCustomJoints[kI]->S * qdd_temp;
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}